

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Value from_owner_procedure(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  Am_Object owner;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&owner,in_RSI);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    iVar2 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
    in_value = Am_Object::Get(&owner,*(Am_Slot_Key *)
                                      &((Am_Wrapper *)CONCAT44(extraout_var,iVar2))->field_0xc,0);
    Am_Value::operator=((Am_Value *)self,in_value);
    Am_Wrapper::Release((Am_Wrapper *)CONCAT44(extraout_var,iVar2));
  }
  else {
    Am_Value::Set_Value_Type((Am_Value *)self,1);
  }
  Am_Object::~Am_Object(&owner);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

static Am_Value
from_owner_procedure(Am_Object &self)
{
  Am_Value value;
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Key_Store_Data *store =
        (Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
    value = owner.Get(store->key);
    store->Release();
  } else
    value.Set_Value_Type(Am_ZERO); //not there, return a ZERO type
  return value;
}